

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Vector<unsigned_int,_3> __thiscall
gl4cts::Math::notEqual<3>(Math *this,Vector<double,_3> *left,Vector<double,_3> *right)

{
  Vector<unsigned_int,_3> VVar1;
  Vector<bool,_3> local_23;
  Vector<double,_3> *local_20;
  Vector<double,_3> *right_local;
  Vector<double,_3> *left_local;
  
  local_20 = right;
  right_local = left;
  left_local = (Vector<double,_3> *)this;
  tcu::notEqual<double,3>((tcu *)&local_23,left,right);
  VVar1 = convertBvecToUvec<3>(this,&local_23);
  VVar1.m_data._0_8_ = this;
  return (Vector<unsigned_int,_3>)VVar1.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> notEqual(const tcu::Vector<glw::GLdouble, Size>& left,
											   const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::notEqual(left, right));
}